

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uefitool_main.cpp
# Opt level: O0

void __thiscall
UEFIToolApplication::UEFIToolApplication(UEFIToolApplication *this,int *argc,char **argv)

{
  UEFITool *this_00;
  QString local_90;
  QString local_78;
  QString local_60;
  QString local_38;
  char **local_20;
  char **argv_local;
  int *argc_local;
  UEFIToolApplication *this_local;
  
  local_20 = argv;
  argv_local = (char **)argc;
  argc_local = (int *)this;
  QApplication::QApplication(&this->super_QApplication,argc,argv,0x60204);
  *(undefined ***)this = &PTR_metaObject_0037a440;
  QString::QString(&local_38,"CodeRush");
  QCoreApplication::setOrganizationName((QString *)&local_38);
  QString::~QString(&local_38);
  QString::QString(&local_60,"coderush.me");
  QCoreApplication::setOrganizationDomain((QString *)&local_60);
  QString::~QString(&local_60);
  QString::QString(&local_78,"UEFITool");
  QCoreApplication::setApplicationName((QString *)&local_78);
  QString::~QString(&local_78);
  QString::QString(&local_90,"uefitool");
  QGuiApplication::setDesktopFileName((QString *)&local_90);
  QString::~QString(&local_90);
  this_00 = (UEFITool *)operator_new(0x100);
  UEFITool::UEFITool(this_00,(QWidget *)0x0);
  this->tool = this_00;
  return;
}

Assistant:

UEFIToolApplication(int &argc, char **argv)
    : QApplication(argc, argv)
    {
        setOrganizationName("CodeRush");
        setOrganizationDomain("coderush.me");
        setApplicationName("UEFITool");
#if QT_VERSION >= QT_VERSION_CHECK(5, 7, 0)
        setDesktopFileName("uefitool");
#endif
        tool = new UEFITool();
    }